

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O2

void __thiscall t_javame_generator::init_generator(t_javame_generator *this)

{
  t_program *this_00;
  int iVar1;
  int *piVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  char *pcVar5;
  string subdir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&dir,this);
  iVar1 = mkdir(dir._M_dataplus._M_p,0x1ff);
  std::__cxx11::string::~string((string *)&dir);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    if (*piVar2 != 0x11) {
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_b8,this);
      std::__cxx11::string::string
                ((string *)&subdir,local_b8._M_dataplus._M_p,(allocator *)&local_d8);
      std::operator+(&dir,&subdir,": ");
      pcVar5 = strerror(*piVar2);
      std::operator+(pbVar4,&dir,pcVar5);
      __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  this_00 = (this->super_t_oop_generator).super_t_generator.program_;
  std::__cxx11::string::string((string *)&local_50,"java",(allocator *)&subdir);
  t_program::get_namespace(&dir,this_00,&local_50);
  std::__cxx11::string::operator=((string *)&this->package_name_,(string *)&dir);
  std::__cxx11::string::~string((string *)&dir);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&dir,(string *)&this->package_name_);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&subdir,this);
  do {
    lVar3 = std::__cxx11::string::find((char *)&dir,0x2fd4e8);
    if (lVar3 == -1) {
      if (dir._M_string_length != 0) {
        std::operator+(&local_d8,&subdir,"/");
        std::operator+(&local_b8,&local_d8,&dir);
        std::__cxx11::string::operator=((string *)&subdir,(string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_d8);
        iVar1 = mkdir(subdir._M_dataplus._M_p,0x1ff);
        if (iVar1 == -1) {
          piVar2 = __errno_location();
          if (*piVar2 != 0x11) {
            pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __cxa_allocate_exception(0x20);
            std::__cxx11::string::string
                      ((string *)&local_d8,subdir._M_dataplus._M_p,(allocator *)&local_70);
            std::operator+(&local_b8,&local_d8,": ");
            pcVar5 = strerror(*piVar2);
            std::operator+(pbVar4,&local_b8,pcVar5);
            __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
        }
      }
      std::__cxx11::string::_M_assign((string *)&this->package_dir_);
      std::__cxx11::string::~string((string *)&subdir);
      std::__cxx11::string::~string((string *)&dir);
      return;
    }
    std::operator+(&local_d8,&subdir,"/");
    std::__cxx11::string::substr((ulong)&local_70,(ulong)&dir);
    std::operator+(&local_b8,&local_d8,&local_70);
    std::__cxx11::string::operator=((string *)&subdir,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_d8);
    iVar1 = mkdir(subdir._M_dataplus._M_p,0x1ff);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      if (*piVar2 != 0x11) {
        pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
        std::__cxx11::string::string
                  ((string *)&local_d8,subdir._M_dataplus._M_p,(allocator *)&local_70);
        std::operator+(&local_b8,&local_d8,": ");
        pcVar5 = strerror(*piVar2);
        std::operator+(pbVar4,&local_b8,pcVar5);
        __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
    }
    std::__cxx11::string::substr((ulong)&local_b8,(ulong)&dir);
    std::__cxx11::string::operator=((string *)&dir,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  } while( true );
}

Assistant:

void t_javame_generator::init_generator() {
  // Make output directory
  MKDIR(get_out_dir().c_str());
  package_name_ = program_->get_namespace("java");

  string dir = package_name_;
  string subdir = get_out_dir();
  string::size_type loc;
  while ((loc = dir.find(".")) != string::npos) {
    subdir = subdir + "/" + dir.substr(0, loc);
    MKDIR(subdir.c_str());
    dir = dir.substr(loc + 1);
  }
  if (dir.size() > 0) {
    subdir = subdir + "/" + dir;
    MKDIR(subdir.c_str());
  }

  package_dir_ = subdir;
}